

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::arraypool::~arraypool(arraypool *this)

{
  long lVar1;
  
  if (this->toparray != (char **)0x0) {
    for (lVar1 = 0; lVar1 < this->toparraylen; lVar1 = lVar1 + 1) {
      free(this->toparray[lVar1]);
    }
    free(this->toparray);
  }
  this->toparraylen = 0;
  this->toparray = (char **)0x0;
  this->objects = 0;
  this->totalmemory = 0;
  return;
}

Assistant:

tetgenmesh::arraypool::~arraypool()
{
  int i;

  // Has anything been allocated at all?
  if (toparray != (char **) NULL) {
    // Walk through the top array.
    for (i = 0; i < toparraylen; i++) {
      // Check every pointer; NULLs may be scattered randomly.
      if (toparray[i] != (char *) NULL) {
        // Free an allocated block.
        free((void *) toparray[i]);
      }
    }
    // Free the top array.
    free((void *) toparray);
  }

  // The top array is no longer allocated.
  toparray = (char **) NULL;
  toparraylen = 0;
  objects = 0;
  totalmemory = 0;
}